

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  byte bVar19;
  int iVar20;
  int iVar21;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar22;
  long lVar23;
  long lVar24;
  byte bVar25;
  byte bVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  size_t sVar32;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar36 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined4 uVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  uint uVar69;
  uint uVar70;
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  long lStack_2680;
  undefined1 local_2648 [16];
  Geometry *local_2638;
  ulong local_2630;
  Scene *local_2628;
  StackItemT<embree::NodeRefPtr<8>_> *local_2620;
  ulong local_2618;
  long local_2610;
  RTCFilterFunctionNArguments args;
  undefined8 local_25d8;
  undefined8 uStack_25d0;
  undefined1 local_25c8 [16];
  undefined1 local_25b8 [16];
  undefined1 local_25a8 [16];
  undefined1 local_2598 [16];
  byte local_2587;
  float local_2578 [4];
  float local_2568 [4];
  undefined1 local_2558 [16];
  undefined1 local_2548 [16];
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined8 local_24f8;
  undefined8 uStack_24f0;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  local_2620 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar51 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar73 = ZEXT3264(auVar51);
  auVar52 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar74 = ZEXT3264(auVar52);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar75 = ZEXT3264(auVar53);
  auVar36 = vmulss_avx512f(auVar51._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar60 = auVar36._0_4_;
  auVar51._4_4_ = uVar60;
  auVar51._0_4_ = uVar60;
  auVar51._8_4_ = uVar60;
  auVar51._12_4_ = uVar60;
  auVar51._16_4_ = uVar60;
  auVar51._20_4_ = uVar60;
  auVar51._24_4_ = uVar60;
  auVar51._28_4_ = uVar60;
  auVar36 = vmulss_avx512f(auVar52._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar60 = auVar36._0_4_;
  auVar52._4_4_ = uVar60;
  auVar52._0_4_ = uVar60;
  auVar52._8_4_ = uVar60;
  auVar52._12_4_ = uVar60;
  auVar52._16_4_ = uVar60;
  auVar52._20_4_ = uVar60;
  auVar52._24_4_ = uVar60;
  auVar52._28_4_ = uVar60;
  auVar36 = vmulss_avx512f(auVar53._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar60 = auVar36._0_4_;
  auVar53._4_4_ = uVar60;
  auVar53._0_4_ = uVar60;
  auVar53._8_4_ = uVar60;
  auVar53._12_4_ = uVar60;
  auVar53._16_4_ = uVar60;
  auVar53._20_4_ = uVar60;
  auVar53._24_4_ = uVar60;
  auVar53._28_4_ = uVar60;
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar29 = uVar31 ^ 0x20;
  iVar2 = (tray->tfar).field_0.i[k];
  auVar62 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  auVar54._8_4_ = 0x80000000;
  auVar54._0_8_ = 0x8000000080000000;
  auVar54._12_4_ = 0x80000000;
  auVar54._16_4_ = 0x80000000;
  auVar54._20_4_ = 0x80000000;
  auVar54._24_4_ = 0x80000000;
  auVar54._28_4_ = 0x80000000;
  auVar51 = vxorps_avx512vl(auVar51,auVar54);
  auVar76 = ZEXT3264(auVar51);
  auVar51 = vxorps_avx512vl(auVar52,auVar54);
  auVar77 = ZEXT3264(auVar51);
  auVar51 = vxorps_avx512vl(auVar53,auVar54);
  auVar78 = ZEXT3264(auVar51);
  auVar51 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar79 = ZEXT3264(auVar51);
  auVar36 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar80 = ZEXT1664(auVar36);
  auVar51 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar81 = ZEXT3264(auVar51);
  auVar51 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar82 = ZEXT3264(auVar51);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar83 = ZEXT1664(auVar36);
  auVar51 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
  auVar84 = ZEXT3264(auVar51);
  local_2618 = uVar31;
LAB_01d922c2:
  do {
    if (local_2620 == stack) {
      return;
    }
    pSVar22 = local_2620 + -1;
    local_2620 = local_2620 + -1;
  } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar22->dist);
  sVar32 = (local_2620->ptr).ptr;
LAB_01d922ec:
  do {
    if ((sVar32 & 8) != 0) break;
    auVar51 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(sVar32 + 0x40 + uVar31),auVar76._0_32_,
                         auVar73._0_32_);
    auVar52 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(sVar32 + 0x40 + uVar28),auVar77._0_32_,
                         auVar74._0_32_);
    auVar51 = vpmaxsd_avx2(auVar51,auVar52);
    auVar52 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(sVar32 + 0x40 + uVar34),auVar78._0_32_,
                         auVar75._0_32_);
    auVar52 = vpmaxsd_avx512vl(auVar52,auVar79._0_32_);
    auVar51 = vpmaxsd_avx2(auVar51,auVar52);
    auVar52 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(sVar32 + 0x40 + uVar29),auVar76._0_32_,
                         auVar73._0_32_);
    auVar53 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(sVar32 + 0x40 + (uVar28 ^ 0x20)),auVar77._0_32_,
                         auVar74._0_32_);
    auVar52 = vpminsd_avx2(auVar52,auVar53);
    auVar53 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(sVar32 + 0x40 + (uVar34 ^ 0x20)),auVar78._0_32_,
                         auVar75._0_32_);
    auVar53 = vpminsd_avx2(auVar53,auVar62._0_32_);
    auVar52 = vpminsd_avx2(auVar52,auVar53);
    uVar33 = vpcmpd_avx512vl(auVar51,auVar52,2);
    bVar26 = (byte)uVar33;
    if (bVar26 == 0) goto LAB_01d922c2;
    auVar52 = *(undefined1 (*) [32])(sVar32 & 0xfffffffffffffff0);
    auVar53 = ((undefined1 (*) [32])(sVar32 & 0xfffffffffffffff0))[1];
    auVar54 = vmovdqa64_avx512vl(auVar81._0_32_);
    auVar54 = vpternlogd_avx512vl(auVar54,auVar51,auVar82._0_32_,0xf8);
    auVar55 = vpcompressd_avx512vl(auVar54);
    auVar56._0_4_ = (uint)(bVar26 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar54._0_4_;
    bVar35 = (bool)((byte)(uVar33 >> 1) & 1);
    auVar56._4_4_ = (uint)bVar35 * auVar55._4_4_ | (uint)!bVar35 * auVar54._4_4_;
    bVar35 = (bool)((byte)(uVar33 >> 2) & 1);
    auVar56._8_4_ = (uint)bVar35 * auVar55._8_4_ | (uint)!bVar35 * auVar54._8_4_;
    bVar35 = (bool)((byte)(uVar33 >> 3) & 1);
    auVar56._12_4_ = (uint)bVar35 * auVar55._12_4_ | (uint)!bVar35 * auVar54._12_4_;
    bVar35 = (bool)((byte)(uVar33 >> 4) & 1);
    auVar56._16_4_ = (uint)bVar35 * auVar55._16_4_ | (uint)!bVar35 * auVar54._16_4_;
    bVar35 = (bool)((byte)(uVar33 >> 5) & 1);
    auVar56._20_4_ = (uint)bVar35 * auVar55._20_4_ | (uint)!bVar35 * auVar54._20_4_;
    bVar35 = (bool)((byte)(uVar33 >> 6) & 1);
    auVar56._24_4_ = (uint)bVar35 * auVar55._24_4_ | (uint)!bVar35 * auVar54._24_4_;
    bVar35 = SUB81(uVar33 >> 7,0);
    auVar56._28_4_ = (uint)bVar35 * auVar55._28_4_ | (uint)!bVar35 * auVar54._28_4_;
    auVar54 = vpermt2q_avx512vl(auVar52,auVar56,auVar53);
    sVar32 = auVar54._0_8_;
    bVar26 = bVar26 - 1 & bVar26;
    if (bVar26 != 0) {
      auVar54 = vpshufd_avx2(auVar56,0x55);
      vpermt2q_avx512vl(auVar52,auVar54,auVar53);
      auVar55 = vpminsd_avx2(auVar56,auVar54);
      auVar54 = vpmaxsd_avx2(auVar56,auVar54);
      bVar26 = bVar26 - 1 & bVar26;
      if (bVar26 == 0) {
        auVar55 = vpermi2q_avx512vl(auVar55,auVar52,auVar53);
        sVar32 = auVar55._0_8_;
        auVar52 = vpermt2q_avx512vl(auVar52,auVar54,auVar53);
        (local_2620->ptr).ptr = auVar52._0_8_;
        lVar23 = 8;
        lStack_2680 = 0x10;
      }
      else {
        auVar67 = vpshufd_avx2(auVar56,0xaa);
        vpermt2q_avx512vl(auVar52,auVar67,auVar53);
        auVar58 = vpminsd_avx2(auVar55,auVar67);
        auVar55 = vpmaxsd_avx2(auVar55,auVar67);
        auVar67 = vpminsd_avx2(auVar54,auVar55);
        auVar55 = vpmaxsd_avx2(auVar54,auVar55);
        bVar26 = bVar26 - 1 & bVar26;
        if (bVar26 == 0) {
          auVar54 = vpermi2q_avx512vl(auVar58,auVar52,auVar53);
          sVar32 = auVar54._0_8_;
          auVar54 = vpermt2q_avx512vl(auVar52,auVar55,auVar53);
          (local_2620->ptr).ptr = auVar54._0_8_;
          auVar54 = vpermd_avx2(auVar55,auVar51);
          local_2620->dist = auVar54._0_4_;
          auVar52 = vpermt2q_avx512vl(auVar52,auVar67,auVar53);
          local_2620[1].ptr.ptr = auVar52._0_8_;
          lStack_2680 = 0x18;
          lVar23 = lStack_2680;
          lStack_2680 = 0x20;
          auVar54 = auVar67;
        }
        else {
          auVar54 = vpshufd_avx2(auVar56,0xff);
          vpermt2q_avx512vl(auVar52,auVar54,auVar53);
          auVar59 = vpminsd_avx2(auVar58,auVar54);
          auVar58 = vpmaxsd_avx2(auVar58,auVar54);
          auVar54 = vpminsd_avx2(auVar67,auVar58);
          auVar58 = vpmaxsd_avx2(auVar67,auVar58);
          auVar67 = vpminsd_avx2(auVar55,auVar58);
          auVar55 = vpmaxsd_avx2(auVar55,auVar58);
          bVar26 = bVar26 - 1 & bVar26;
          if (bVar26 != 0) {
            auVar57 = valignd_avx512vl(auVar56,auVar56,3);
            auVar58 = vmovdqa64_avx512vl(auVar84._0_32_);
            auVar59 = vpermt2d_avx512vl(auVar83._0_32_,auVar84._0_32_,auVar59);
            auVar56 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
            auVar54 = vpermt2d_avx512vl(auVar59,auVar56,auVar54);
            auVar56 = vpermt2d_avx512vl(auVar54,auVar56,auVar67);
            auVar54 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
            auVar54 = vpermt2d_avx512vl(auVar56,auVar54,auVar55);
            auVar84 = ZEXT3264(auVar54);
            bVar25 = bVar26;
            do {
              auVar55 = auVar84._0_32_;
              auVar67._8_4_ = 1;
              auVar67._0_8_ = 0x100000001;
              auVar67._12_4_ = 1;
              auVar67._16_4_ = 1;
              auVar67._20_4_ = 1;
              auVar67._24_4_ = 1;
              auVar67._28_4_ = 1;
              auVar54 = vpermd_avx2(auVar67,auVar57);
              auVar57 = valignd_avx512vl(auVar57,auVar57,1);
              vpermt2q_avx512vl(auVar52,auVar57,auVar53);
              bVar25 = bVar25 - 1 & bVar25;
              uVar18 = vpcmpd_avx512vl(auVar54,auVar55,5);
              auVar54 = vpmaxsd_avx2(auVar54,auVar55);
              bVar19 = (byte)uVar18 << 1;
              auVar55 = valignd_avx512vl(auVar55,auVar55,7);
              bVar35 = (bool)((byte)uVar18 & 1);
              bVar10 = (bool)(bVar19 >> 2 & 1);
              bVar11 = (bool)(bVar19 >> 3 & 1);
              bVar12 = (bool)(bVar19 >> 4 & 1);
              bVar13 = (bool)(bVar19 >> 5 & 1);
              bVar14 = (bool)(bVar19 >> 6 & 1);
              auVar84 = ZEXT3264(CONCAT428((uint)(bVar19 >> 7) * auVar55._28_4_ |
                                           (uint)!(bool)(bVar19 >> 7) * auVar54._28_4_,
                                           CONCAT424((uint)bVar14 * auVar55._24_4_ |
                                                     (uint)!bVar14 * auVar54._24_4_,
                                                     CONCAT420((uint)bVar13 * auVar55._20_4_ |
                                                               (uint)!bVar13 * auVar54._20_4_,
                                                               CONCAT416((uint)bVar12 *
                                                                         auVar55._16_4_ |
                                                                         (uint)!bVar12 *
                                                                         auVar54._16_4_,
                                                                         CONCAT412((uint)bVar11 *
                                                                                   auVar55._12_4_ |
                                                                                   (uint)!bVar11 *
                                                                                   auVar54._12_4_,
                                                                                   CONCAT48((uint)
                                                  bVar10 * auVar55._8_4_ |
                                                  (uint)!bVar10 * auVar54._8_4_,
                                                  CONCAT44((uint)bVar35 * auVar55._4_4_ |
                                                           (uint)!bVar35 * auVar54._4_4_,
                                                           auVar54._0_4_))))))));
            } while (bVar25 != 0);
            lVar23 = (ulong)(uint)POPCOUNT((uint)bVar26) + 3;
            while( true ) {
              auVar55 = auVar84._0_32_;
              auVar54 = vpermt2q_avx512vl(auVar52,auVar55,auVar53);
              sVar32 = auVar54._0_8_;
              bVar35 = lVar23 == 0;
              lVar23 = lVar23 + -1;
              if (bVar35) break;
              (local_2620->ptr).ptr = sVar32;
              auVar54 = vpermd_avx2(auVar55,auVar51);
              local_2620->dist = auVar54._0_4_;
              auVar54 = valignd_avx512vl(auVar55,auVar55,1);
              auVar84 = ZEXT3264(auVar54);
              local_2620 = local_2620 + 1;
            }
            auVar83 = ZEXT3264(auVar83._0_32_);
            auVar51 = vmovdqa64_avx512vl(auVar58);
            auVar84 = ZEXT3264(auVar51);
            goto LAB_01d922ec;
          }
          auVar56 = vpermi2q_avx512vl(auVar59,auVar52,auVar53);
          sVar32 = auVar56._0_8_;
          auVar56 = vpermt2q_avx512vl(auVar52,auVar55,auVar53);
          (local_2620->ptr).ptr = auVar56._0_8_;
          auVar55 = vpermd_avx2(auVar55,auVar51);
          local_2620->dist = auVar55._0_4_;
          auVar55 = vpermt2q_avx512vl(auVar52,auVar67,auVar53);
          local_2620[1].ptr.ptr = auVar55._0_8_;
          auVar55 = vpermd_avx2(auVar67,auVar51);
          local_2620[1].dist = auVar55._0_4_;
          auVar52 = vpermt2q_avx512vl(auVar52,auVar54,auVar53);
          local_2620[2].ptr.ptr = auVar52._0_8_;
          lVar23 = 0x28;
          lStack_2680 = 0x30;
        }
      }
      auVar51 = vpermd_avx2(auVar54,auVar51);
      *(int *)((long)&(local_2620->ptr).ptr + lVar23) = auVar51._0_4_;
      local_2620 = (StackItemT<embree::NodeRefPtr<8>_> *)
                   ((long)&(local_2620->ptr).ptr + lStack_2680);
    }
  } while( true );
  local_2610 = (ulong)((uint)sVar32 & 0xf) - 8;
  uVar33 = sVar32 & 0xfffffffffffffff0;
  for (lVar23 = 0; lVar23 != local_2610; lVar23 = lVar23 + 1) {
    lVar24 = lVar23 * 0x50;
    local_2628 = context->scene;
    ppfVar4 = (local_2628->vertices).items;
    pfVar5 = ppfVar4[*(uint *)(uVar33 + 0x30 + lVar24)];
    pfVar6 = ppfVar4[*(uint *)(uVar33 + 0x34 + lVar24)];
    pfVar7 = ppfVar4[*(uint *)(uVar33 + 0x38 + lVar24)];
    pfVar8 = ppfVar4[*(uint *)(uVar33 + 0x3c + lVar24)];
    auVar48 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar33 + lVar24)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 8 + lVar24)));
    auVar36 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar33 + lVar24)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 8 + lVar24)));
    auVar68 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + 4 + lVar24)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar33 + 0xc + lVar24)));
    auVar49 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + 4 + lVar24)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar33 + 0xc + lVar24)));
    auVar42 = vunpcklps_avx(auVar36,auVar49);
    auVar40 = vunpcklps_avx(auVar48,auVar68);
    auVar41 = vunpckhps_avx(auVar48,auVar68);
    auVar48 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar33 + 0x10 + lVar24)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 0x18 + lVar24)));
    auVar36 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar33 + 0x10 + lVar24)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 0x18 + lVar24)));
    auVar68 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + 0x14 + lVar24)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar33 + 0x1c + lVar24)));
    auVar49 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + 0x14 + lVar24)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar33 + 0x1c + lVar24)));
    auVar46 = vunpcklps_avx(auVar36,auVar49);
    auVar39 = vunpcklps_avx(auVar48,auVar68);
    auVar49 = vunpckhps_avx(auVar48,auVar68);
    auVar68 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar33 + 0x20 + lVar24)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 0x28 + lVar24)));
    auVar36 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar33 + 0x20 + lVar24)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 0x28 + lVar24)));
    auVar47 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + 0x24 + lVar24)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar33 + 0x2c + lVar24)));
    auVar48 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + 0x24 + lVar24)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar33 + 0x2c + lVar24)));
    auVar37 = vunpcklps_avx(auVar36,auVar48);
    auVar38 = vunpcklps_avx(auVar68,auVar47);
    puVar1 = (undefined8 *)(uVar33 + 0x30 + lVar24);
    local_24f8 = *puVar1;
    uStack_24f0 = puVar1[1];
    auVar47 = vunpckhps_avx(auVar68,auVar47);
    puVar1 = (undefined8 *)(uVar33 + 0x40 + lVar24);
    local_25d8 = *puVar1;
    uStack_25d0 = puVar1[1];
    auVar36 = vsubps_avx(auVar40,auVar39);
    auVar49 = vsubps_avx(auVar41,auVar49);
    auVar48 = vsubps_avx(auVar42,auVar46);
    auVar68 = vsubps_avx(auVar38,auVar40);
    auVar47 = vsubps_avx(auVar47,auVar41);
    auVar46 = vsubps_avx(auVar37,auVar42);
    auVar37._0_4_ = auVar49._0_4_ * auVar46._0_4_;
    auVar37._4_4_ = auVar49._4_4_ * auVar46._4_4_;
    auVar37._8_4_ = auVar49._8_4_ * auVar46._8_4_;
    auVar37._12_4_ = auVar49._12_4_ * auVar46._12_4_;
    local_2548 = vfmsub231ps_fma(auVar37,auVar47,auVar48);
    auVar38._0_4_ = auVar48._0_4_ * auVar68._0_4_;
    auVar38._4_4_ = auVar48._4_4_ * auVar68._4_4_;
    auVar38._8_4_ = auVar48._8_4_ * auVar68._8_4_;
    auVar38._12_4_ = auVar48._12_4_ * auVar68._12_4_;
    local_2538 = vfmsub231ps_fma(auVar38,auVar46,auVar36);
    auVar43._0_4_ = auVar36._0_4_ * auVar47._0_4_;
    auVar43._4_4_ = auVar36._4_4_ * auVar47._4_4_;
    auVar43._8_4_ = auVar36._8_4_ * auVar47._8_4_;
    auVar43._12_4_ = auVar36._12_4_ * auVar47._12_4_;
    uVar60 = *(undefined4 *)(ray + k * 4 + 0x40);
    auVar72._4_4_ = uVar60;
    auVar72._0_4_ = uVar60;
    auVar72._8_4_ = uVar60;
    auVar72._12_4_ = uVar60;
    auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
    auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
    uVar60 = *(undefined4 *)(ray + k * 4);
    auVar39._4_4_ = uVar60;
    auVar39._0_4_ = uVar60;
    auVar39._8_4_ = uVar60;
    auVar39._12_4_ = uVar60;
    auVar39 = vsubps_avx512vl(auVar40,auVar39);
    local_2528 = vfmsub231ps_fma(auVar43,auVar68,auVar49);
    uVar60 = *(undefined4 *)(ray + k * 4 + 0x10);
    auVar40._4_4_ = uVar60;
    auVar40._0_4_ = uVar60;
    auVar40._8_4_ = uVar60;
    auVar40._12_4_ = uVar60;
    auVar40 = vsubps_avx512vl(auVar41,auVar40);
    uVar60 = *(undefined4 *)(ray + k * 4 + 0x20);
    auVar41._4_4_ = uVar60;
    auVar41._0_4_ = uVar60;
    auVar41._8_4_ = uVar60;
    auVar41._12_4_ = uVar60;
    auVar41 = vsubps_avx512vl(auVar42,auVar41);
    auVar42 = vmulps_avx512vl(auVar37,auVar41);
    auVar43 = vfmsub231ps_avx512vl(auVar42,auVar40,auVar38);
    auVar42 = vmulps_avx512vl(auVar38,auVar39);
    auVar44 = vfmsub231ps_avx512vl(auVar42,auVar41,auVar72);
    auVar42 = vmulps_avx512vl(auVar72,auVar40);
    auVar45 = vfmsub231ps_avx512vl(auVar42,auVar39,auVar37);
    auVar42 = vmulps_avx512vl(local_2528,auVar38);
    auVar42 = vfmadd231ps_avx512vl(auVar42,local_2538,auVar37);
    auVar37 = vfmadd231ps_avx512vl(auVar42,local_2548,auVar72);
    auVar42._8_4_ = 0x7fffffff;
    auVar42._0_8_ = 0x7fffffff7fffffff;
    auVar42._12_4_ = 0x7fffffff;
    local_2598 = vandps_avx512vl(auVar37,auVar42);
    auVar42 = vandps_avx512vl(auVar37,auVar83._0_16_);
    auVar46 = vmulps_avx512vl(auVar46,auVar45);
    auVar47 = vfmadd231ps_avx512vl(auVar46,auVar44,auVar47);
    auVar68 = vfmadd231ps_fma(auVar47,auVar43,auVar68);
    uVar69 = auVar42._0_4_;
    local_25c8._0_4_ = (float)(uVar69 ^ auVar68._0_4_);
    uVar27 = auVar42._4_4_;
    local_25c8._4_4_ = (float)(uVar27 ^ auVar68._4_4_);
    uVar30 = auVar42._8_4_;
    local_25c8._8_4_ = (float)(uVar30 ^ auVar68._8_4_);
    uVar70 = auVar42._12_4_;
    local_25c8._12_4_ = (float)(uVar70 ^ auVar68._12_4_);
    auVar48 = vmulps_avx512vl(auVar48,auVar45);
    auVar49 = vfmadd231ps_avx512vl(auVar48,auVar49,auVar44);
    auVar36 = vfmadd231ps_fma(auVar49,auVar36,auVar43);
    local_25b8._0_4_ = (float)(uVar69 ^ auVar36._0_4_);
    local_25b8._4_4_ = (float)(uVar27 ^ auVar36._4_4_);
    local_25b8._8_4_ = (float)(uVar30 ^ auVar36._8_4_);
    local_25b8._12_4_ = (float)(uVar70 ^ auVar36._12_4_);
    auVar36 = ZEXT816(0) << 0x20;
    uVar18 = vcmpps_avx512vl(local_25c8,auVar36,5);
    uVar15 = vcmpps_avx512vl(local_25b8,auVar36,5);
    uVar16 = vcmpps_avx512vl(auVar37,auVar36,4);
    auVar36._0_4_ = local_25c8._0_4_ + local_25b8._0_4_;
    auVar36._4_4_ = local_25c8._4_4_ + local_25b8._4_4_;
    auVar36._8_4_ = local_25c8._8_4_ + local_25b8._8_4_;
    auVar36._12_4_ = local_25c8._12_4_ + local_25b8._12_4_;
    uVar17 = vcmpps_avx512vl(auVar36,local_2598,2);
    bVar26 = (byte)uVar18 & (byte)uVar15 & (byte)uVar16 & (byte)uVar17;
    if (bVar26 != 0) {
      auVar48._0_4_ = auVar41._0_4_ * local_2528._0_4_;
      auVar48._4_4_ = auVar41._4_4_ * local_2528._4_4_;
      auVar48._8_4_ = auVar41._8_4_ * local_2528._8_4_;
      auVar48._12_4_ = auVar41._12_4_ * local_2528._12_4_;
      auVar36 = vfmadd213ps_fma(auVar40,local_2538,auVar48);
      auVar36 = vfmadd213ps_fma(auVar39,local_2548,auVar36);
      uVar60 = *(undefined4 *)(ray + k * 4 + 0x30);
      auVar49._4_4_ = uVar60;
      auVar49._0_4_ = uVar60;
      auVar49._8_4_ = uVar60;
      auVar49._12_4_ = uVar60;
      auVar49 = vmulps_avx512vl(local_2598,auVar49);
      fVar71 = *(float *)(ray + k * 4 + 0x80);
      local_25a8._0_4_ = (float)(uVar69 ^ auVar36._0_4_);
      local_25a8._4_4_ = (float)(uVar27 ^ auVar36._4_4_);
      local_25a8._8_4_ = (float)(uVar30 ^ auVar36._8_4_);
      local_25a8._12_4_ = (float)(uVar70 ^ auVar36._12_4_);
      auVar68._0_4_ = fVar71 * local_2598._0_4_;
      auVar68._4_4_ = fVar71 * local_2598._4_4_;
      auVar68._8_4_ = fVar71 * local_2598._8_4_;
      auVar68._12_4_ = fVar71 * local_2598._12_4_;
      uVar18 = vcmpps_avx512vl(local_25a8,auVar68,2);
      uVar15 = vcmpps_avx512vl(auVar49,local_25a8,1);
      bVar26 = (byte)uVar18 & (byte)uVar15 & bVar26;
      if (bVar26 != 0) {
        local_2587 = bVar26;
        auVar36 = vrcp14ps_avx512vl(local_2598);
        auVar47._8_4_ = 0x3f800000;
        auVar47._0_8_ = 0x3f8000003f800000;
        auVar47._12_4_ = 0x3f800000;
        auVar49 = vfnmadd213ps_avx512vl(local_2598,auVar36,auVar47);
        auVar36 = vfmadd132ps_fma(auVar49,auVar36,auVar36);
        fVar63 = auVar36._0_4_;
        local_2558._0_4_ = fVar63 * local_25a8._0_4_;
        fVar64 = auVar36._4_4_;
        local_2558._4_4_ = fVar64 * local_25a8._4_4_;
        fVar65 = auVar36._8_4_;
        local_2558._8_4_ = fVar65 * local_25a8._8_4_;
        fVar66 = auVar36._12_4_;
        local_2558._12_4_ = fVar66 * local_25a8._12_4_;
        auVar62 = ZEXT1664(local_2558);
        local_2578[0] = fVar63 * local_25c8._0_4_;
        local_2578[1] = fVar64 * local_25c8._4_4_;
        local_2578[2] = fVar65 * local_25c8._8_4_;
        local_2578[3] = fVar66 * local_25c8._12_4_;
        local_2568[0] = fVar63 * local_25b8._0_4_;
        local_2568[1] = fVar64 * local_25b8._4_4_;
        local_2568[2] = fVar65 * local_25b8._8_4_;
        local_2568[3] = fVar66 * local_25b8._12_4_;
        auVar44._8_4_ = 0x7f800000;
        auVar44._0_8_ = 0x7f8000007f800000;
        auVar44._12_4_ = 0x7f800000;
        auVar36 = vblendmps_avx512vl(auVar44,local_2558);
        auVar46._0_4_ = (uint)(bVar26 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar26 & 1) * 0x7f800000;
        bVar35 = (bool)(bVar26 >> 1 & 1);
        auVar46._4_4_ = (uint)bVar35 * auVar36._4_4_ | (uint)!bVar35 * 0x7f800000;
        bVar35 = (bool)(bVar26 >> 2 & 1);
        auVar46._8_4_ = (uint)bVar35 * auVar36._8_4_ | (uint)!bVar35 * 0x7f800000;
        bVar35 = (bool)(bVar26 >> 3 & 1);
        auVar46._12_4_ = (uint)bVar35 * auVar36._12_4_ | (uint)!bVar35 * 0x7f800000;
        auVar36 = vshufps_avx(auVar46,auVar46,0xb1);
        auVar36 = vminps_avx(auVar36,auVar46);
        auVar49 = vshufpd_avx(auVar36,auVar36,1);
        auVar36 = vminps_avx(auVar49,auVar36);
        uVar18 = vcmpps_avx512vl(auVar46,auVar36,0);
        bVar25 = (byte)uVar18 & bVar26;
        do {
          bVar19 = bVar26;
          if (bVar25 != 0) {
            bVar19 = bVar25;
          }
          uVar69 = 0;
          for (uVar27 = (uint)bVar19; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
            uVar69 = uVar69 + 1;
          }
          uVar30 = uVar69 & 0xff;
          local_2630 = (ulong)uVar30;
          uVar27 = *(uint *)((long)&local_24f8 + local_2630 * 4);
          local_2638 = (local_2628->geometries).items[uVar27].ptr;
          if ((local_2638->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            bVar26 = ~(byte)(1 << (uVar69 & 0x1f)) & bVar26;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (local_2638->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar31 = (ulong)(uVar30 << 2);
              uVar60 = *(undefined4 *)((long)local_2578 + uVar31);
              uVar3 = *(undefined4 *)((long)local_2568 + uVar31);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2558 + uVar31);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2548 + uVar31);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2538 + uVar31);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2528 + uVar31);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar60;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_25d8 + uVar31);
              *(uint *)(ray + k * 4 + 0x120) = uVar27;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              break;
            }
            local_2518 = auVar62._0_16_;
            auVar51 = vmovdqu64_avx512vl(auVar79._0_32_);
            uVar31 = (ulong)(uVar30 * 4);
            uVar60 = *(undefined4 *)((long)local_2578 + uVar31);
            h.u.field_0.i[1] = uVar60;
            h.u.field_0.i[0] = uVar60;
            h.u.field_0.i[2] = uVar60;
            h.u.field_0.i[3] = uVar60;
            h.v.field_0.v[0] = *(float *)((long)local_2568 + uVar31);
            h.geomID.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpbroadcastd_avx512vl()
            ;
            uVar60 = *(undefined4 *)((long)&local_25d8 + uVar31);
            h.primID.field_0.i[1] = uVar60;
            h.primID.field_0.i[0] = uVar60;
            h.primID.field_0.i[2] = uVar60;
            h.primID.field_0.i[3] = uVar60;
            uVar60 = *(undefined4 *)(local_2548 + uVar31);
            h.Ng.field_0._4_4_ = uVar60;
            h.Ng.field_0._0_4_ = uVar60;
            h.Ng.field_0._8_4_ = uVar60;
            h.Ng.field_0._12_4_ = uVar60;
            h.Ng.field_0._16_4_ = *(undefined4 *)(local_2538 + uVar31);
            uVar60 = *(undefined4 *)(local_2528 + uVar31);
            h.Ng.field_0._36_4_ = uVar60;
            h.Ng.field_0._32_4_ = uVar60;
            h.Ng.field_0._40_4_ = uVar60;
            h.Ng.field_0._44_4_ = uVar60;
            h.Ng.field_0._20_4_ = h.Ng.field_0._16_4_;
            h.Ng.field_0._24_4_ = h.Ng.field_0._16_4_;
            h.Ng.field_0._28_4_ = h.Ng.field_0._16_4_;
            h.v.field_0.v[1] = h.v.field_0.v[0];
            h.v.field_0.v[2] = h.v.field_0.v[0];
            h.v.field_0.v[3] = h.v.field_0.v[0];
            vpcmpeqd_avx2(ZEXT1632((undefined1  [16])h.u.field_0),
                          ZEXT1632((undefined1  [16])h.u.field_0));
            h.instID[0].field_0.i[1] = context->user->instID[0];
            h.instID[0].field_0.i[0] = h.instID[0].field_0.i[1];
            h.instID[0].field_0.i[2] = h.instID[0].field_0.i[1];
            h.instID[0].field_0.i[3] = h.instID[0].field_0.i[1];
            h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
            h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2558 + uVar31);
            auVar36 = auVar80._0_16_;
            local_2648 = vmovdqa64_avx512vl(auVar36);
            args.valid = (int *)local_2648;
            args.geometryUserPtr = local_2638->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)&h;
            args.N = 4;
            local_2508 = vmovdqa64_avx512vl(auVar36);
            auVar36 = vmovdqa64_avx512vl(auVar36);
            args.ray = (RTCRayN *)ray;
            if (local_2638->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*local_2638->intersectionFilterN)(&args);
              auVar36 = local_2648;
            }
            uVar31 = vptestmd_avx512vl(auVar36,auVar36);
            if ((uVar31 & 0xf) == 0) {
LAB_01d92cfe:
              *(float *)(ray + k * 4 + 0x80) = fVar71;
            }
            else {
              p_Var9 = context->args->filter;
              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((local_2638->field_8).field_0x2 & 0x40) != 0))
                 )) {
                (*p_Var9)(&args);
                auVar36 = local_2648;
              }
              uVar31 = vptestmd_avx512vl(auVar36,auVar36);
              uVar31 = uVar31 & 0xf;
              bVar25 = (byte)uVar31;
              if (bVar25 == 0) goto LAB_01d92cfe;
              iVar2 = *(int *)(args.hit + 4);
              iVar20 = *(int *)(args.hit + 8);
              iVar21 = *(int *)(args.hit + 0xc);
              bVar35 = (bool)((byte)(uVar31 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
              bVar11 = SUB81(uVar31 >> 3,0);
              *(uint *)(args.ray + 0xc0) =
                   (uint)(bVar25 & 1) * *(int *)args.hit |
                   (uint)!(bool)(bVar25 & 1) * *(uint *)(args.ray + 0xc0);
              *(uint *)(args.ray + 0xc4) =
                   (uint)bVar35 * iVar2 | (uint)!bVar35 * *(int *)(args.ray + 0xc4);
              *(uint *)(args.ray + 200) =
                   (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(args.ray + 200);
              *(uint *)(args.ray + 0xcc) =
                   (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(args.ray + 0xcc);
              iVar2 = *(int *)(args.hit + 0x14);
              iVar20 = *(int *)(args.hit + 0x18);
              iVar21 = *(int *)(args.hit + 0x1c);
              bVar35 = (bool)((byte)(uVar31 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
              bVar11 = SUB81(uVar31 >> 3,0);
              *(uint *)(args.ray + 0xd0) =
                   (uint)(bVar25 & 1) * *(int *)(args.hit + 0x10) |
                   (uint)!(bool)(bVar25 & 1) * *(uint *)(args.ray + 0xd0);
              *(uint *)(args.ray + 0xd4) =
                   (uint)bVar35 * iVar2 | (uint)!bVar35 * *(int *)(args.ray + 0xd4);
              *(uint *)(args.ray + 0xd8) =
                   (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(args.ray + 0xd8);
              *(uint *)(args.ray + 0xdc) =
                   (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(args.ray + 0xdc);
              iVar2 = *(int *)(args.hit + 0x24);
              iVar20 = *(int *)(args.hit + 0x28);
              iVar21 = *(int *)(args.hit + 0x2c);
              bVar35 = (bool)((byte)(uVar31 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
              bVar11 = SUB81(uVar31 >> 3,0);
              *(uint *)(args.ray + 0xe0) =
                   (uint)(bVar25 & 1) * *(int *)(args.hit + 0x20) |
                   (uint)!(bool)(bVar25 & 1) * *(uint *)(args.ray + 0xe0);
              *(uint *)(args.ray + 0xe4) =
                   (uint)bVar35 * iVar2 | (uint)!bVar35 * *(int *)(args.ray + 0xe4);
              *(uint *)(args.ray + 0xe8) =
                   (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(args.ray + 0xe8);
              *(uint *)(args.ray + 0xec) =
                   (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(args.ray + 0xec);
              iVar2 = *(int *)(args.hit + 0x34);
              iVar20 = *(int *)(args.hit + 0x38);
              iVar21 = *(int *)(args.hit + 0x3c);
              bVar35 = (bool)((byte)(uVar31 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
              bVar11 = SUB81(uVar31 >> 3,0);
              *(uint *)(args.ray + 0xf0) =
                   (uint)(bVar25 & 1) * *(int *)(args.hit + 0x30) |
                   (uint)!(bool)(bVar25 & 1) * *(uint *)(args.ray + 0xf0);
              *(uint *)(args.ray + 0xf4) =
                   (uint)bVar35 * iVar2 | (uint)!bVar35 * *(int *)(args.ray + 0xf4);
              *(uint *)(args.ray + 0xf8) =
                   (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(args.ray + 0xf8);
              *(uint *)(args.ray + 0xfc) =
                   (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(args.ray + 0xfc);
              iVar2 = *(int *)(args.hit + 0x44);
              iVar20 = *(int *)(args.hit + 0x48);
              iVar21 = *(int *)(args.hit + 0x4c);
              bVar35 = (bool)((byte)(uVar31 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
              bVar11 = SUB81(uVar31 >> 3,0);
              *(uint *)(args.ray + 0x100) =
                   (uint)(bVar25 & 1) * *(int *)(args.hit + 0x40) |
                   (uint)!(bool)(bVar25 & 1) * *(uint *)(args.ray + 0x100);
              *(uint *)(args.ray + 0x104) =
                   (uint)bVar35 * iVar2 | (uint)!bVar35 * *(int *)(args.ray + 0x104);
              *(uint *)(args.ray + 0x108) =
                   (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(args.ray + 0x108);
              *(uint *)(args.ray + 0x10c) =
                   (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(args.ray + 0x10c);
              auVar36 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
              *(undefined1 (*) [16])(args.ray + 0x110) = auVar36;
              auVar36 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
              *(undefined1 (*) [16])(args.ray + 0x120) = auVar36;
              auVar36 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
              *(undefined1 (*) [16])(args.ray + 0x130) = auVar36;
              auVar36 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
              *(undefined1 (*) [16])(args.ray + 0x140) = auVar36;
              fVar71 = *(float *)(ray + k * 4 + 0x80);
            }
            auVar45._4_4_ = fVar71;
            auVar45._0_4_ = fVar71;
            auVar45._8_4_ = fVar71;
            auVar45._12_4_ = fVar71;
            auVar62 = ZEXT1664(local_2518);
            uVar18 = vcmpps_avx512vl(local_2518,auVar45,2);
            bVar26 = ~(byte)(1 << ((uint)local_2630 & 0x1f)) & bVar26 & (byte)uVar18;
            auVar73 = ZEXT3264(auVar73._0_32_);
            auVar74 = ZEXT3264(auVar74._0_32_);
            auVar75 = ZEXT3264(auVar75._0_32_);
            auVar76 = ZEXT3264(auVar76._0_32_);
            auVar77 = ZEXT3264(auVar77._0_32_);
            auVar78 = ZEXT3264(auVar78._0_32_);
            auVar51 = vmovdqu64_avx512vl(auVar51);
            auVar79 = ZEXT3264(auVar51);
            auVar36 = vmovdqa64_avx512vl(local_2508);
            auVar80 = ZEXT1664(auVar36);
            auVar51 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
            auVar81 = ZEXT3264(auVar51);
            auVar51 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
            auVar82 = ZEXT3264(auVar51);
            auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar83 = ZEXT1664(auVar36);
            auVar51 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar84 = ZEXT3264(auVar51);
          }
          if (bVar26 == 0) break;
          auVar61._8_4_ = 0x7f800000;
          auVar61._0_8_ = 0x7f8000007f800000;
          auVar61._12_4_ = 0x7f800000;
          auVar36 = vblendmps_avx512vl(auVar61,auVar62._0_16_);
          auVar50._0_4_ =
               (uint)(bVar26 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar26 & 1) * 0x7f800000;
          bVar35 = (bool)(bVar26 >> 1 & 1);
          auVar50._4_4_ = (uint)bVar35 * auVar36._4_4_ | (uint)!bVar35 * 0x7f800000;
          bVar35 = (bool)(bVar26 >> 2 & 1);
          auVar50._8_4_ = (uint)bVar35 * auVar36._8_4_ | (uint)!bVar35 * 0x7f800000;
          bVar35 = (bool)(bVar26 >> 3 & 1);
          auVar50._12_4_ = (uint)bVar35 * auVar36._12_4_ | (uint)!bVar35 * 0x7f800000;
          auVar36 = vshufps_avx(auVar50,auVar50,0xb1);
          auVar36 = vminps_avx(auVar36,auVar50);
          auVar49 = vshufpd_avx(auVar36,auVar36,1);
          auVar36 = vminps_avx(auVar49,auVar36);
          uVar18 = vcmpps_avx512vl(auVar50,auVar36,0);
          bVar25 = (byte)uVar18 & bVar26;
        } while( true );
      }
    }
    uVar31 = local_2618;
  }
  uVar60 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar62 = ZEXT3264(CONCAT428(uVar60,CONCAT424(uVar60,CONCAT420(uVar60,CONCAT416(uVar60,CONCAT412(
                                                  uVar60,CONCAT48(uVar60,CONCAT44(uVar60,uVar60)))))
                                               )));
  goto LAB_01d922c2;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }